

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apropos.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  Port *pPVar2;
  reference pvVar3;
  void *unaff_retaddr;
  Port *p;
  char *in_stack_00000040;
  Ports *in_stack_00000048;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 uVar4;
  
  uVar4 = 0;
  pPVar2 = rtosc::Ports::apropos(in_stack_00000048,in_stack_00000040);
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[](&ports.ports,0);
  assert_ptr_eq(unaff_retaddr,(void *)CONCAT44(uVar4,in_stack_fffffffffffffff8),(char *)pPVar2,
                in_stack_ffffffffffffffec);
  pPVar2 = rtosc::Ports::apropos(in_stack_00000048,in_stack_00000040);
  pvVar3 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[](&ports.ports,2);
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[](&pvVar3->ports->ports,0);
  assert_ptr_eq(unaff_retaddr,(void *)CONCAT44(uVar4,in_stack_fffffffffffffff8),(char *)pPVar2,
                in_stack_ffffffffffffffec);
  pPVar2 = rtosc::Ports::apropos(in_stack_00000048,in_stack_00000040);
  pvVar3 = std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[](&ports.ports,3);
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[](&pvVar3->ports->ports,0);
  assert_ptr_eq(unaff_retaddr,(void *)CONCAT44(uVar4,in_stack_fffffffffffffff8),(char *)pPVar2,
                in_stack_ffffffffffffffec);
  pPVar2 = rtosc::Ports::apropos(in_stack_00000048,in_stack_00000040);
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::operator[](&ports.ports,4);
  assert_ptr_eq(unaff_retaddr,(void *)CONCAT44(uVar4,in_stack_fffffffffffffff8),(char *)pPVar2,
                in_stack_ffffffffffffffec);
  pPVar2 = rtosc::Ports::apropos(in_stack_00000048,in_stack_00000040);
  assert_ptr_eq(unaff_retaddr,(void *)CONCAT44(uVar4,in_stack_fffffffffffffff8),(char *)pPVar2,
                in_stack_ffffffffffffffec);
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    const Port *p;
    p = ports.apropos("/setstring");
    assert_ptr_eq(&ports.ports[0], p, "no subtree", __LINE__);
    p = ports.apropos("/subtree1/port");
    assert_ptr_eq(&ports.ports[2].ports->ports[0], p, "normal subtree", __LINE__);
    p = ports.apropos("/subtree2/x/port");
    assert_ptr_eq(&ports.ports[3].ports->ports[0], p, "subtree with 2 slashes", __LINE__);
    // this is not good style, but it still shall not cause memory errors:
    p = ports.apropos("/no/subtree/");
    assert_ptr_eq(&ports.ports[4], p, "trailing slash without subtree", __LINE__);
    p = ports.apropos("/VoicePar1/Enabled");
    // this is a bug: it should match "&ports.ports[6]", but currently it fails,
    // because it dives into ports.ports[5] and then aborts
    assert_ptr_eq(nullptr, p, "array", __LINE__);

    return test_summary();
}